

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_regex.cpp
# Opt level: O0

any * __thiscall
Omega_h::regex::Reader::at_shift(any *__return_storage_ptr__,Reader *this,int token,string *text)

{
  int iVar1;
  char *pcVar2;
  ostream *poVar3;
  string *text_local;
  int token_local;
  Reader *this_local;
  
  if (token == 0) {
    iVar1 = Omega_h::size(text);
    if (iVar1 == 1) {
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)text);
      any::any<char&,void>(__return_storage_ptr__,pcVar2);
    }
    else {
      iVar1 = Omega_h::size(text);
      if (iVar1 != 2) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"BUG: regex char text is \"");
        poVar3 = std::operator<<(poVar3,(string *)text);
        std::operator<<(poVar3,"\"\n");
        abort();
      }
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)text);
      if (*pcVar2 != '\\') {
        fail("assertion %s failed at %s +%d\n","text[0] == \'\\\\\'",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_regex.cpp"
             ,0xa5);
      }
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)text);
      any::any<char&,void>(__return_storage_ptr__,pcVar2);
    }
  }
  else {
    any::any(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

any regex::Reader::at_shift(int token, std::string& text) {
  if (token != TOK_CHAR) {
    return any();
  }
  if (size(text) == 1) {
    return any(text[0]);
  } else if (size(text) == 2) {
    OMEGA_H_CHECK(text[0] == '\\');
    return any(text[1]);
  } else {
    std::cerr << "BUG: regex char text is \"" << text << "\"\n";
    abort();
  }
}